

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O2

void __thiscall mjs::gc_heap::gc_heap(gc_heap *this,void *storage,uint32_t capacity)

{
  pointer_set::pointer_set(&this->pointers_);
  allocation_context::allocation_context(&this->alloc_context_,storage,capacity);
  this->owns_storage_ = false;
  (this->gc_state_).level = 0;
  (this->gc_state_).new_context = (allocation_context *)0x0;
  (this->gc_state_).pending_fixups.
  super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gc_state_).pending_fixups.
  super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gc_state_).pending_fixups.
  super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->gc_state_).weak_fixups.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gc_state_).weak_fixups.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gc_state_).weak_fixups.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

gc_heap::gc_heap(void* storage, uint32_t capacity) : alloc_context_(storage, capacity), owns_storage_(false) {
}